

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O3

void dirSAVECDTFull(path *cdtname)

{
  bool bVar1;
  byte *palette_00;
  long lVar2;
  byte screenMode;
  bool opt [19];
  aint args [19];
  byte palette [17];
  bool local_98 [32];
  int local_78 [2];
  aint aaStack_70 [17];
  byte abStack_2a [26];
  
  aaStack_70[0] = 0;
  aaStack_70[1] = 0;
  aaStack_70[0xe] = 0;
  aaStack_70[0xf] = 0;
  aaStack_70[0x10] = 0;
  aaStack_70[10] = 0;
  aaStack_70[0xb] = 0;
  aaStack_70[0xc] = 0;
  aaStack_70[0xd] = 0;
  aaStack_70[6] = 0;
  aaStack_70[7] = 0;
  aaStack_70[8] = 0;
  aaStack_70[9] = 0;
  aaStack_70[2] = 0;
  aaStack_70[3] = 0;
  aaStack_70[4] = 0;
  aaStack_70[5] = 0;
  local_78[0] = StartAddress;
  local_78[1] = 0xff;
  local_98[0] = false;
  local_98[1] = true;
  local_98[2] = true;
  local_98[3] = true;
  local_98[4] = true;
  local_98[5] = true;
  local_98[6] = true;
  local_98[7] = true;
  local_98[8] = true;
  local_98[9] = true;
  local_98[10] = true;
  local_98[0xb] = true;
  local_98[0xc] = true;
  local_98[0xd] = true;
  local_98[0xe] = true;
  local_98[0xf] = true;
  local_98[0x10] = true;
  local_98[0x11] = true;
  local_98[0x12] = true;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = getIntArguments<19>(&lp,(aint (*) [19])local_78,(bool (*) [19])local_98);
    if (!bVar1) {
      Error("[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]"
            ,lp,SUPPRESS);
      return;
    }
    if (local_78[1] != 0xff) {
      lVar2 = 2;
      do {
        abStack_2a[lVar2] = (byte)local_78[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x13);
      screenMode = (byte)local_78[1];
      palette_00 = abStack_2a + 2;
      goto LAB_00113605;
    }
  }
  palette_00 = "\x01\x01\x18\x14\x06\x1a";
  screenMode = '\x01';
LAB_00113605:
  SaveCDT_SnapshotWithPalette(cdtname,local_78[0],screenMode,palette_00);
  return;
}

Assistant:

static void dirSAVECDTFull(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]";

	aint args[] = {
		StartAddress,
		0xFF, 0, // mode, border
		0, 0, 0, 0, 0, 0, 0, 0, // palette
		0, 0, 0, 0, 0, 0, 0, 0,
	};

	bool opt[] = {
		false,	// this is used only when comma was parsed after cdtname => not optional then
		true, true,
		true, true, true, true, true, true, true, true,
		true, true, true, true, true, true, true, true,
	};

	if (anyComma(lp) && !getIntArguments<19>(lp, args, opt)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	if (args[1] != 0xFF) {
		byte palette[17];
		for (aint i = 0; i < 17; ++i) {
			palette[i] = args[2 + i];
		}

		SaveCDT_SnapshotWithPalette(cdtname, args[0], args[1], palette);
	}
	else {
		SaveCDT_Snapshot(cdtname, args[0]);
	}
}